

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall
notch::io::PlainTextNetworkWriter::saveWeightsAndBias
          (PlainTextNetworkWriter *this,Array *weights,Array *bias)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  float *pfVar4;
  ulong local_40;
  size_t c;
  size_t r;
  size_t nInputs;
  size_t nOutputs;
  Array *bias_local;
  Array *weights_local;
  PlainTextNetworkWriter *this_local;
  
  sVar1 = core::std::valarray<float>::size(bias);
  sVar2 = core::std::valarray<float>::size(weights);
  for (c = 0; c < sVar1; c = c + 1) {
    std::operator<<(this->out,"   ");
    poVar3 = std::operator<<(this->out," ");
    pfVar4 = core::std::valarray<float>::operator[](bias,c);
    std::ostream::operator<<(poVar3,*pfVar4);
    for (local_40 = 0; local_40 < sVar2 / sVar1; local_40 = local_40 + 1) {
      poVar3 = std::operator<<(this->out," ");
      pfVar4 = core::std::valarray<float>::operator[](weights,c * (sVar2 / sVar1) + local_40);
      std::ostream::operator<<(poVar3,*pfVar4);
    }
    std::operator<<(this->out,"\n");
  }
  return;
}

Assistant:

void saveWeightsAndBias(const Array &weights, const Array &bias) {
        size_t nOutputs = bias.size();
        size_t nInputs = weights.size() / nOutputs;
        for (size_t r = 0; r < nOutputs; ++r) {
            out << "   ";
            out << " " << bias[r];
            for (size_t c = 0; c < nInputs; ++c) {
                out << " " << weights[r*nInputs + c];
            }
            out << "\n";
        }
    }